

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_type.hpp
# Opt level: O3

void __thiscall
ExchCXX::detail::BuiltinKernelImpl<ExchCXX::BuiltinR2SCAN_C,void>::
eval_exc_vxc_<int&,double_const*&,double_const*&,double_const*&,double_const*&,double*&,double*&,double*&,double*&,double*&>
          (BuiltinKernelImpl<ExchCXX::BuiltinR2SCAN_C,void> *this,int *args,double **args_1,
          double **args_2,double **args_3,double **args_4,double **args_5,double **args_6,
          double **args_7,double **args_8,double **args_9)

{
  if (*(int *)(this + 8) == 0) {
    host_eval_exc_vxc_helper_polar<ExchCXX::BuiltinR2SCAN_C>
              (*args,*args_1,*args_2,*args_3,*args_4,*args_5,*args_6,*args_7,*args_8,*args_9);
  }
  else {
    host_eval_exc_vxc_helper_unpolar<ExchCXX::BuiltinR2SCAN_C>
              (*args,*args_1,*args_2,*args_3,*args_4,*args_5,*args_6,*args_7,*args_8,*args_9);
  }
  return;
}

Assistant:

void eval_exc_vxc_(Args&&... args) const {
    if( is_polarized() )
      host_eval_exc_vxc_helper_polar<KernelType>(
        std::forward<Args>(args)...
      );
    else
      host_eval_exc_vxc_helper_unpolar<KernelType>(
        std::forward<Args>(args)...
      );
  }